

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

container_t *
container_remove_range(container_t *c,uint8_t type,uint32_t min,uint32_t max,uint8_t *result_type)

{
  uint16_t uVar1;
  int iVar2;
  int iVar3;
  uint32_t pos;
  int32_t iVar4;
  int32_t iVar5;
  run_container_t *run;
  int32_t result_cardinality_1;
  int32_t nvals_less;
  int32_t nvals_greater;
  array_container_t *array;
  int32_t result_cardinality;
  bitset_container_t *bitset;
  uint8_t *result_type_local;
  uint32_t max_local;
  uint32_t min_local;
  uint8_t type_local;
  container_t *c_local;
  
  c_local = c;
  if (type == '\x01') {
    iVar3 = *c;
    iVar2 = bitset_lenrange_cardinality(*(uint64_t **)((long)c + 8),min,max - min);
    iVar3 = iVar3 - iVar2;
    if (iVar3 == 0) {
      c_local = (container_t *)0x0;
    }
    else if (iVar3 < 0x1000) {
      *result_type = '\x02';
      bitset_reset_range(*(uint64_t **)((long)c + 8),min,max + 1);
      *(int *)c = iVar3;
      c_local = array_container_from_bitset((bitset_container_t *)c);
    }
    else {
      *result_type = '\x01';
      bitset_reset_range(*(uint64_t **)((long)c + 8),min,max + 1);
      *(int *)c = iVar3;
    }
  }
  else if (type == '\x02') {
    iVar4 = count_greater(*(uint16_t **)((long)c + 8),*c,(uint16_t)max);
    pos = count_less(*(uint16_t **)((long)c + 8),*c - iVar4,(uint16_t)min);
    if (pos + iVar4 == 0) {
      c_local = (container_t *)0x0;
    }
    else {
      *result_type = '\x02';
      array_container_remove_range((array_container_t *)c,pos,*c - (pos + iVar4));
    }
  }
  else if (*c == 0) {
    c_local = (container_t *)0x0;
  }
  else {
    uVar1 = run_container_minimum((run_container_t *)c);
    if ((min <= uVar1) && (uVar1 = run_container_maximum((run_container_t *)c), uVar1 <= max)) {
      return (container_t *)0x0;
    }
    run_container_remove_range((run_container_t *)c,min,max);
    iVar4 = run_container_serialized_size_in_bytes(*c);
    iVar5 = bitset_container_serialized_size_in_bytes();
    if (iVar5 < iVar4) {
      *result_type = '\x01';
      c_local = bitset_container_from_run((run_container_t *)c);
    }
    else {
      *result_type = '\x03';
    }
  }
  return c_local;
}

Assistant:

static inline container_t *container_remove_range(
    container_t *c, uint8_t type,
    uint32_t min, uint32_t max,
    uint8_t *result_type
){
     switch (type) {
        case BITSET_CONTAINER_TYPE: {
            bitset_container_t *bitset = CAST_bitset(c);

            int32_t result_cardinality = bitset->cardinality -
                bitset_lenrange_cardinality(bitset->words, min, max-min);

            if (result_cardinality == 0) {
                return NULL;
            } else if (result_cardinality < DEFAULT_MAX_SIZE) {
                *result_type = ARRAY_CONTAINER_TYPE;
                bitset_reset_range(bitset->words, min, max+1);
                bitset->cardinality = result_cardinality;
                return array_container_from_bitset(bitset);
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                bitset_reset_range(bitset->words, min, max+1);
                bitset->cardinality = result_cardinality;
                return bitset;
            }
        }
        case ARRAY_CONTAINER_TYPE: {
            array_container_t *array = CAST_array(c);

            int32_t nvals_greater = count_greater(array->array, array->cardinality, max);
            int32_t nvals_less = count_less(array->array, array->cardinality - nvals_greater, min);
            int32_t result_cardinality = nvals_less + nvals_greater;

            if (result_cardinality == 0) {
                return NULL;
            } else {
                *result_type = ARRAY_CONTAINER_TYPE;
                array_container_remove_range(array, nvals_less,
                    array->cardinality - result_cardinality);
                return array;
            }
        }
        case RUN_CONTAINER_TYPE: {
            run_container_t *run = CAST_run(c);

            if (run->n_runs == 0) {
                return NULL;
            }
            if (min <= run_container_minimum(run) && max >= run_container_maximum(run)) {
                return NULL;
            }

            run_container_remove_range(run, min, max);

            if (run_container_serialized_size_in_bytes(run->n_runs) <=
                    bitset_container_serialized_size_in_bytes()) {
                *result_type = RUN_CONTAINER_TYPE;
                return run;
            } else {
                *result_type = BITSET_CONTAINER_TYPE;
                return bitset_container_from_run(run);
            }
        }
        default:
            __builtin_unreachable();
     }
}